

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioCfgInternals(uint cfgWhat,uint cfgVal)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_ESI;
  uint in_EDI;
  int retVal;
  int local_c;
  
  pFVar1 = _stderr;
  local_c = -0x22;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: cfgWhat=%u, cfgVal=%d\n",pcVar2,"gpioCfgInternals",(ulong)in_EDI,
            (ulong)in_ESI);
  }
  pFVar1 = _stderr;
  if (in_EDI == 0x2186d6f1) {
    if (in_ESI == 0) {
      gpioCfg.internals = gpioCfg.internals & 0xfffffdff;
    }
    else {
      gpioCfg.internals = gpioCfg.internals | 0x200;
    }
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: show stats is %u\n",pcVar2,"gpioCfgInternals",(ulong)in_ESI);
    }
    local_c = 0;
  }
  else if ((in_EDI == 0x3ab249ff) && (in_ESI < 9)) {
    gpioCfg.internals = gpioCfg.internals & 0xfffffff0 | in_ESI;
    gpioCfg.dbgLevel = in_ESI;
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: Debug level is %u\n",pcVar2,"gpioCfgInternals",(ulong)in_ESI);
    }
    local_c = 0;
  }
  return local_c;
}

Assistant:

int gpioCfgInternals(unsigned cfgWhat, unsigned cfgVal)
{
   int retVal = PI_BAD_CFG_INTERNAL;

   DBG(DBG_USER, "cfgWhat=%u, cfgVal=%d", cfgWhat, cfgVal);

   switch(cfgWhat)
   {
      case 562484977:

         if (cfgVal) gpioCfg.internals |= PI_CFG_STATS;
         else gpioCfg.internals &= (~PI_CFG_STATS);

         DBG(DBG_ALWAYS, "show stats is %u", cfgVal);

         retVal = 0;

         break;

      case 984762879:

         if ((cfgVal >= DBG_ALWAYS) && (cfgVal <= DBG_MAX_LEVEL))
         {
            
            gpioCfg.dbgLevel = cfgVal;
            gpioCfg.internals = (gpioCfg.internals & (~0xF)) | cfgVal;

            DBG(DBG_ALWAYS, "Debug level is %u", cfgVal);

            retVal = 0;
         }

         break;
   }

   return retVal;
}